

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.cc
# Opt level: O0

uint64_t SIPHASH_24(uint64_t *key,uint8_t *input,size_t input_len)

{
  uint64_t uVar1;
  uint64_t last_block_word;
  uint8_t last_block [8];
  uint64_t m;
  uint64_t v [4];
  size_t orig_input_len;
  size_t input_len_local;
  uint8_t *input_local;
  uint64_t *key_local;
  
  m = *key ^ 0x736f6d6570736575;
  v[0] = key[1] ^ 0x646f72616e646f6d;
  v[1] = *key ^ 0x6c7967656e657261;
  v[2] = key[1] ^ 0x7465646279746573;
  v[3] = input_len;
  input_len_local = (size_t)input;
  for (orig_input_len = input_len; 7 < orig_input_len; orig_input_len = orig_input_len - 8) {
    last_block = (uint8_t  [8])CRYPTO_load_u64_le((void *)input_len_local);
    v[2] = (ulong)last_block ^ v[2];
    siphash_round(&m);
    siphash_round(&m);
    m = (ulong)last_block ^ m;
    input_len_local = input_len_local + 8;
  }
  OPENSSL_memset(&last_block_word,0,8);
  OPENSSL_memcpy(&last_block_word,(void *)input_len_local,orig_input_len);
  last_block_word._7_1_ = (undefined1)v[3];
  uVar1 = CRYPTO_load_u64_le(&last_block_word);
  v[2] = uVar1 ^ v[2];
  siphash_round(&m);
  siphash_round(&m);
  m = uVar1 ^ m;
  v[1] = v[1] ^ 0xff;
  siphash_round(&m);
  siphash_round(&m);
  siphash_round(&m);
  siphash_round(&m);
  return m ^ v[0] ^ v[1] ^ v[2];
}

Assistant:

uint64_t SIPHASH_24(const uint64_t key[2], const uint8_t *input,
                    size_t input_len) {
  const size_t orig_input_len = input_len;

  uint64_t v[4];
  v[0] = key[0] ^ UINT64_C(0x736f6d6570736575);
  v[1] = key[1] ^ UINT64_C(0x646f72616e646f6d);
  v[2] = key[0] ^ UINT64_C(0x6c7967656e657261);
  v[3] = key[1] ^ UINT64_C(0x7465646279746573);

  while (input_len >= sizeof(uint64_t)) {
    uint64_t m = CRYPTO_load_u64_le(input);
    v[3] ^= m;
    siphash_round(v);
    siphash_round(v);
    v[0] ^= m;

    input += sizeof(uint64_t);
    input_len -= sizeof(uint64_t);
  }

  uint8_t last_block[8];
  OPENSSL_memset(last_block, 0, sizeof(last_block));
  OPENSSL_memcpy(last_block, input, input_len);
  last_block[7] = orig_input_len & 0xff;

  uint64_t last_block_word = CRYPTO_load_u64_le(last_block);
  v[3] ^= last_block_word;
  siphash_round(v);
  siphash_round(v);
  v[0] ^= last_block_word;

  v[2] ^= 0xff;
  siphash_round(v);
  siphash_round(v);
  siphash_round(v);
  siphash_round(v);

  return v[0] ^ v[1] ^ v[2] ^ v[3];
}